

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LifNeuron.cpp
# Opt level: O1

void __thiscall LifNeuron::LifNeuron(LifNeuron *this)

{
  _Hashtable<ISynapse_*,_ISynapse_*,_std::allocator<ISynapse_*>,_std::__detail::_Identity,_std::equal_to<ISynapse_*>,_std::hash<ISynapse_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_58;
  
  INeuron::INeuron(&this->super_INeuron,0.0,0.01,true);
  *(undefined ***)this = &PTR_ProcessInputSpike_00105c20;
  local_58._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_58._M_element_count = 0;
  local_58._M_bucket_count = 1;
  local_58._M_rehash_policy._M_max_load_factor = 1.0;
  local_58._M_rehash_policy._4_4_ = 0;
  local_58._M_rehash_policy._M_next_resize = 0;
  local_58._M_single_bucket = (__node_base_ptr)0x0;
  local_58._M_buckets = &local_58._M_single_bucket;
  std::
  _Hashtable<ISynapse_*,_ISynapse_*,_std::allocator<ISynapse_*>,_std::__detail::_Identity,_std::equal_to<ISynapse_*>,_std::hash<ISynapse_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::_M_move_assign((_Hashtable<ISynapse_*,_ISynapse_*,_std::allocator<ISynapse_*>,_std::__detail::_Identity,_std::equal_to<ISynapse_*>,_std::hash<ISynapse_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    *)&this->field_0x80,&local_58);
  std::
  _Hashtable<ISynapse_*,_ISynapse_*,_std::allocator<ISynapse_*>,_std::__detail::_Identity,_std::equal_to<ISynapse_*>,_std::hash<ISynapse_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_58);
  local_58._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_58._M_element_count = 0;
  local_58._M_bucket_count = 1;
  local_58._M_rehash_policy._M_max_load_factor = 1.0;
  local_58._M_rehash_policy._4_4_ = 0;
  local_58._M_rehash_policy._M_next_resize = 0;
  local_58._M_single_bucket = (__node_base_ptr)0x0;
  local_58._M_buckets = &local_58._M_single_bucket;
  std::
  _Hashtable<ISynapse_*,_ISynapse_*,_std::allocator<ISynapse_*>,_std::__detail::_Identity,_std::equal_to<ISynapse_*>,_std::hash<ISynapse_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::_M_move_assign((_Hashtable<ISynapse_*,_ISynapse_*,_std::allocator<ISynapse_*>,_std::__detail::_Identity,_std::equal_to<ISynapse_*>,_std::hash<ISynapse_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    *)&this->field_0x48,&local_58);
  std::
  _Hashtable<ISynapse_*,_ISynapse_*,_std::allocator<ISynapse_*>,_std::__detail::_Identity,_std::equal_to<ISynapse_*>,_std::hash<ISynapse_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_58);
  *(undefined8 *)&this->field_0xbc = 0;
  this->a = 0.0;
  this->vMaxThresh = 10.0;
  this->tau = 20.0;
  this->tps = -1.0;
  this->tOut = -1.0;
  this->fts = -1.0;
  *(undefined4 *)&this->field_0xc4 = 0x404f7084;
  this->field_0xc8 = 1;
  *(undefined8 *)&this->field_0xcc = 0;
  this->grad = 0.0;
  this->sigma_mu = 0.0;
  this->DlDV = 0.0;
  this->batchDlDV = 0.0;
  return;
}

Assistant:

LifNeuron::LifNeuron()
{
    outputSynapses = std::unordered_set<ISynapse *>();
    inputSynapses = std::unordered_set<ISynapse *>();
    potential = 0;
    a = 0;
    vMaxThresh = 10;
    tau = 20;
    tps = -1;
    tOut = -1;
    fts = -1;
    tRef = 3.2412423543293534542952;
    consistent = true;
    grad = 0;
    sigma_mu = 0;
    DlDV = 0;
    batchDlDV = 0;
    inputSpikeCounter = 0;
    outputSpikeCounter = 0;
    inductionAffectedSpikes = 0;
}